

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::(anonymous_namespace)::BasicAllTargetsLoadNonMS::ReadCube<tcu::Vector<int,4>>
          (BasicAllTargetsLoadNonMS *this,GLenum internalformat,Vector<int,_4> *value,
          Vector<int,_4> *expected_value)

{
  Vector<int,_4> *__value;
  bool bVar1;
  GLuint GVar2;
  GLenum GVar3;
  GLenum GVar4;
  GLint GVar5;
  GLenum GVar6;
  char *src_fs;
  reference pvVar7;
  bool bVar8;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_unsigned_int>_>::value,_pair<iterator,_bool>_>
  _Var9;
  allocator<char> local_1a1;
  string local_1a0;
  allocator<char> local_179;
  string local_178;
  _Base_ptr local_158;
  undefined1 local_150;
  allocator<char> local_141;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_120;
  GLchar local_f8 [8];
  GLchar name [32];
  GLuint index;
  GLint uniforms;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  name_index_map;
  bool local_8a;
  allocator<tcu::Vector<int,_4>_> local_89;
  undefined1 local_88 [6];
  bool status;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> data;
  int kSize;
  GLuint textures [2];
  string local_58;
  GLuint local_34;
  char *pcStack_30;
  GLuint program;
  char *src_vs;
  Vector<int,_4> *expected_value_local;
  Vector<int,_4> *value_local;
  BasicAllTargetsLoadNonMS *pBStack_10;
  GLenum internalformat_local;
  BasicAllTargetsLoadNonMS *this_local;
  
  pcStack_30 = 
  "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
  ;
  src_vs = (char *)expected_value;
  expected_value_local = value;
  value_local._4_4_ = internalformat;
  pBStack_10 = this;
  GenFSCube<tcu::Vector<int,4>>(&local_58,this,internalformat,expected_value);
  src_fs = (char *)std::__cxx11::string::c_str();
  GVar2 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                    ((ShaderImageLoadStoreBase *)this,
                     "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                     ,(char *)0x0,(char *)0x0,(char *)0x0,src_fs,(bool *)0x0);
  std::__cxx11::string::~string((string *)&local_58);
  local_34 = GVar2;
  glu::CallLogWrapper::glGenTextures
            ((CallLogWrapper *)(this + 8),2,
             (GLuint *)
             ((long)&data.
                     super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  __value = expected_value_local;
  data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0x10;
  std::allocator<tcu::Vector<int,_4>_>::allocator(&local_89);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_88,0xc00,
             __value,&local_89);
  std::allocator<tcu::Vector<int,_4>_>::~allocator(&local_89);
  glu::CallLogWrapper::glBindTexture
            ((CallLogWrapper *)(this + 8),0x8513,
             data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0x8513,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0x8513,0x2800,0x2600);
  GVar6 = value_local._4_4_;
  GVar3 = ShaderImageLoadStoreBase::Format<tcu::Vector<int,4>>((ShaderImageLoadStoreBase *)this);
  GVar4 = ShaderImageLoadStoreBase::Type<tcu::Vector<int,4>>((ShaderImageLoadStoreBase *)this);
  pvVar7 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                     ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_88
                      ,0);
  glu::CallLogWrapper::glTexImage2D
            ((CallLogWrapper *)(this + 8),0x8516,0,GVar6,0x10,0x10,0,GVar3,GVar4,pvVar7);
  GVar6 = value_local._4_4_;
  GVar3 = ShaderImageLoadStoreBase::Format<tcu::Vector<int,4>>((ShaderImageLoadStoreBase *)this);
  GVar4 = ShaderImageLoadStoreBase::Type<tcu::Vector<int,4>>((ShaderImageLoadStoreBase *)this);
  pvVar7 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                     ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_88
                      ,0);
  glu::CallLogWrapper::glTexImage2D
            ((CallLogWrapper *)(this + 8),0x8515,0,GVar6,0x10,0x10,0,GVar3,GVar4,pvVar7);
  GVar6 = value_local._4_4_;
  GVar3 = ShaderImageLoadStoreBase::Format<tcu::Vector<int,4>>((ShaderImageLoadStoreBase *)this);
  GVar4 = ShaderImageLoadStoreBase::Type<tcu::Vector<int,4>>((ShaderImageLoadStoreBase *)this);
  pvVar7 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                     ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_88
                      ,0);
  glu::CallLogWrapper::glTexImage2D
            ((CallLogWrapper *)(this + 8),0x8518,0,GVar6,0x10,0x10,0,GVar3,GVar4,pvVar7);
  GVar6 = value_local._4_4_;
  GVar3 = ShaderImageLoadStoreBase::Format<tcu::Vector<int,4>>((ShaderImageLoadStoreBase *)this);
  GVar4 = ShaderImageLoadStoreBase::Type<tcu::Vector<int,4>>((ShaderImageLoadStoreBase *)this);
  pvVar7 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                     ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_88
                      ,0);
  glu::CallLogWrapper::glTexImage2D
            ((CallLogWrapper *)(this + 8),0x8517,0,GVar6,0x10,0x10,0,GVar3,GVar4,pvVar7);
  GVar6 = value_local._4_4_;
  GVar3 = ShaderImageLoadStoreBase::Format<tcu::Vector<int,4>>((ShaderImageLoadStoreBase *)this);
  GVar4 = ShaderImageLoadStoreBase::Type<tcu::Vector<int,4>>((ShaderImageLoadStoreBase *)this);
  pvVar7 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                     ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_88
                      ,0);
  glu::CallLogWrapper::glTexImage2D
            ((CallLogWrapper *)(this + 8),0x851a,0,GVar6,0x10,0x10,0,GVar3,GVar4,pvVar7);
  GVar6 = value_local._4_4_;
  GVar3 = ShaderImageLoadStoreBase::Format<tcu::Vector<int,4>>((ShaderImageLoadStoreBase *)this);
  GVar4 = ShaderImageLoadStoreBase::Type<tcu::Vector<int,4>>((ShaderImageLoadStoreBase *)this);
  pvVar7 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                     ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_88
                      ,0);
  glu::CallLogWrapper::glTexImage2D
            ((CallLogWrapper *)(this + 8),0x8519,0,GVar6,0x10,0x10,0,GVar3,GVar4,pvVar7);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x8513,0);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x9009,kSize);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0x9009,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0x9009,0x2800,0x2600);
  GVar6 = value_local._4_4_;
  GVar3 = ShaderImageLoadStoreBase::Format<tcu::Vector<int,4>>((ShaderImageLoadStoreBase *)this);
  GVar4 = ShaderImageLoadStoreBase::Type<tcu::Vector<int,4>>((ShaderImageLoadStoreBase *)this);
  pvVar7 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                     ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_88
                      ,0);
  glu::CallLogWrapper::glTexImage3D
            ((CallLogWrapper *)(this + 8),0x9009,0,GVar6,0x10,0x10,0xc,0,GVar3,GVar4,pvVar7);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x9009,0);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),0,
             data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0,'\x01',0,35000,
             value_local._4_4_);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),1,kSize,0,'\x01',0,35000,value_local._4_4_);
  glu::CallLogWrapper::glClear((CallLogWrapper *)(this + 8),0x4000);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),local_34);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_34,"g_image_cube");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar5,0);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_34,"g_image_cube_array");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar5,1);
  glu::CallLogWrapper::glBindVertexArray((CallLogWrapper *)(this + 8),*(GLuint *)(this + 0x28));
  glu::CallLogWrapper::glViewport((CallLogWrapper *)(this + 8),0,0,0x10,0x10);
  glu::CallLogWrapper::glDrawArrays((CallLogWrapper *)(this + 8),5,0,4);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)
             ((long)&name_index_map._M_t._M_impl.super__Rb_tree_header._M_node_count + 4),0.0,1.0,
             0.0,1.0);
  bVar1 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::ValidateReadBuffer
                    ((ShaderImageLoadStoreBase *)this,0,0,0x10,0x10,
                     (vec4 *)((long)&name_index_map._M_t._M_impl.super__Rb_tree_header._M_node_count
                             + 4));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         *)&index);
  glu::CallLogWrapper::glGetProgramiv
            ((CallLogWrapper *)(this + 8),local_34,0x8b86,(GLint *)(name + 0x1c));
  bVar8 = name._28_4_ != 2;
  if (bVar8) {
    gl4cts::anon_unknown_0::Output("ACTIVE_UNIFORMS is %d should be 2.\n",(ulong)(uint)name._28_4_);
  }
  local_8a = !bVar8 && ((bVar1 ^ 0xffU) & 1) == 0;
  name[0x18] = '\0';
  name[0x19] = '\0';
  name[0x1a] = '\0';
  name[0x1b] = '\0';
  for (; GVar2 = local_34, (uint)name._24_4_ < (uint)name._28_4_; name._24_4_ = name._24_4_ + 1) {
    glu::CallLogWrapper::glGetActiveUniformName
              ((CallLogWrapper *)(this + 8),local_34,name._24_4_,0x20,(GLsizei *)0x0,local_f8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,local_f8,&local_141);
    std::make_pair<std::__cxx11::string,unsigned_int&>(&local_120,&local_140,(uint *)(name + 0x18));
    _Var9 = std::
            map<std::__cxx11::string,unsigned_int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
            ::insert<std::pair<std::__cxx11::string,unsigned_int>>
                      ((map<std::__cxx11::string,unsigned_int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                        *)&index,&local_120);
    local_158 = (_Base_ptr)_Var9.first._M_node;
    local_150 = _Var9.second;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair(&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator(&local_141);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"g_image_cube",&local_179)
  ;
  GVar6 = ShaderImageLoadStoreBase::ImageType<tcu::Vector<int,4>>
                    ((ShaderImageLoadStoreBase *)this,0x8513);
  bVar1 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::CheckUniform
                    ((ShaderImageLoadStoreBase *)this,GVar2,&local_178,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      *)&index,1,GVar6);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator(&local_179);
  GVar2 = local_34;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_8a = false;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"g_image_cube_array",&local_1a1);
  GVar6 = ShaderImageLoadStoreBase::ImageType<tcu::Vector<int,4>>
                    ((ShaderImageLoadStoreBase *)this,0x9009);
  bVar1 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::CheckUniform
                    ((ShaderImageLoadStoreBase *)this,GVar2,&local_1a0,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      *)&index,1,GVar6);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_8a = false;
  }
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),0);
  glu::CallLogWrapper::glDeleteProgram((CallLogWrapper *)(this + 8),local_34);
  glu::CallLogWrapper::glDeleteTextures
            ((CallLogWrapper *)(this + 8),2,
             (GLuint *)
             ((long)&data.
                     super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *)&index);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~vector
            ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_88);
  return local_8a;
}

Assistant:

bool ReadCube(GLenum internalformat, const T& value, const T& expected_value)
	{
		const char* src_vs = "#version 420 core" NL "layout(location = 0) in vec4 i_position;" NL "void main() {" NL
							 "  gl_Position = i_position;" NL "}";
		const GLuint program =
			BuildProgram(src_vs, NULL, NULL, NULL, GenFSCube(internalformat, expected_value).c_str());
		GLuint textures[2];
		glGenTextures(2, textures);

		const int	  kSize = 16;
		std::vector<T> data(kSize * kSize * 12, value);

		glBindTexture(GL_TEXTURE_CUBE_MAP, textures[0]);
		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_X, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(),
					 &data[0]);
		glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(),
					 &data[0]);
		glTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(),
					 &data[0]);
		glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Y, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(),
					 &data[0]);
		glTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(),
					 &data[0]);
		glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Z, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(),
					 &data[0]);
		glBindTexture(GL_TEXTURE_CUBE_MAP, 0);

		glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, textures[1]);
		glTexParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, internalformat, kSize, kSize, 12, 0, Format<T>(), Type<T>(),
					 &data[0]);
		glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, 0);

		glBindImageTexture(0, textures[0], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(1, textures[1], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);

		glClear(GL_COLOR_BUFFER_BIT);

		glUseProgram(program);
		glUniform1i(glGetUniformLocation(program, "g_image_cube"), 0);
		glUniform1i(glGetUniformLocation(program, "g_image_cube_array"), 1);

		glBindVertexArray(m_vao);
		glViewport(0, 0, kSize, kSize);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		bool status = true;

		if (!ValidateReadBuffer(0, 0, kSize, kSize, vec4(0, 1, 0, 1)))
		{
			status = false;
		}

		std::map<std::string, GLuint> name_index_map;
		GLint uniforms;
		glGetProgramiv(program, GL_ACTIVE_UNIFORMS, &uniforms);
		if (uniforms != 2)
		{
			status = false;
			Output("ACTIVE_UNIFORMS is %d should be 2.\n", uniforms);
		}
		for (GLuint index = 0; index < static_cast<GLuint>(uniforms); ++index)
		{
			GLchar name[32];
			glGetActiveUniformName(program, index, sizeof(name), NULL, name);
			name_index_map.insert(std::make_pair(std::string(name), index));
		}

		if (!CheckUniform(program, "g_image_cube", name_index_map, 1, ImageType<T>(GL_TEXTURE_CUBE_MAP)))
			status = false;
		if (!CheckUniform(program, "g_image_cube_array", name_index_map, 1, ImageType<T>(GL_TEXTURE_CUBE_MAP_ARRAY)))
			status = false;

		glUseProgram(0);
		glDeleteProgram(program);
		glDeleteTextures(2, textures);

		return status;
	}